

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O2

void alloc_cdef_bufs(AV1_COMMON *cm,uint16_t **colbuf,uint16_t **srcbuf,int num_planes)

{
  uint16_t *puVar1;
  ulong uVar2;
  
  if (*srcbuf == (uint16_t *)0x0) {
    puVar1 = (uint16_t *)aom_memalign(0x10,(cm->cdef_info).allocated_srcbuf_size);
    *srcbuf = puVar1;
    if (puVar1 == (uint16_t *)0x0) {
      aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate *srcbuf");
    }
  }
  if (num_planes < 1) {
    num_planes = 0;
  }
  for (uVar2 = 0; (uint)num_planes != uVar2; uVar2 = uVar2 + 1) {
    if (colbuf[uVar2] == (uint16_t *)0x0) {
      puVar1 = (uint16_t *)aom_malloc((cm->cdef_info).allocated_colbuf_size[uVar2]);
      colbuf[uVar2] = puVar1;
      if (puVar1 == (uint16_t *)0x0) {
        aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate colbuf[plane]");
      }
    }
  }
  return;
}

Assistant:

static inline void alloc_cdef_bufs(AV1_COMMON *const cm, uint16_t **colbuf,
                                   uint16_t **srcbuf, const int num_planes) {
  CdefInfo *cdef_info = &cm->cdef_info;
  if (*srcbuf == NULL)
    CHECK_MEM_ERROR(cm, *srcbuf,
                    aom_memalign(16, cdef_info->allocated_srcbuf_size));

  for (int plane = 0; plane < num_planes; plane++) {
    if (colbuf[plane] == NULL)
      CHECK_MEM_ERROR(cm, colbuf[plane],
                      aom_malloc(cdef_info->allocated_colbuf_size[plane]));
  }
}